

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O1

bool __thiscall
pg::DTLSolver::computeDistanceValues
          (DTLSolver *this,bitset *V,bitset *R,bitset *G,int *val,int player)

{
  long lVar1;
  bitset *Z;
  int iVar2;
  uint v;
  size_t sVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int *piVar15;
  uint *puVar16;
  int *piVar17;
  byte bVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  Game *pGVar23;
  bool bVar24;
  char cVar25;
  
  Z = &this->Z;
  iVar19 = 1;
  do {
    sVar3 = V->_bitssize;
    sVar6 = 0;
    do {
      sVar10 = sVar6;
      if (sVar3 == sVar10) goto LAB_0017ecac;
      sVar6 = sVar10 + 1;
    } while (V->_bits[sVar10] == 0);
    if (sVar3 == sVar10) break;
    uVar7 = (int)((this->super_Solver).game)->n_vertices - 1;
    if (-1 < (int)uVar7) {
      uVar13 = (ulong)uVar7;
      do {
        uVar8 = uVar13 >> 6;
        if ((V->_bits[uVar8] >> (uVar13 & 0x3f) & 1) != 0) {
          uVar11 = 1L << (uVar13 & 0x3f);
          uVar12 = Z->_bits[uVar8];
          if ((uVar12 & uVar11) == 0) {
            Z->_bits[uVar8] = uVar12 | uVar11;
            this->str[uVar13] = -1;
            iVar14 = (this->Q).pointer;
            (this->Q).pointer = iVar14 + 1;
            (this->Q).queue[iVar14] = (uint)uVar13;
            iVar14 = (this->Q).pointer;
            while (iVar14 != 0) {
              (this->Q).pointer = iVar14 + -1;
              uVar20 = (this->Q).queue[(long)iVar14 + -1];
              attractVertices(this,player,uVar20,R,Z,G,
                              ((this->super_Solver).game)->_priority[uVar13]);
              piVar17 = this->tin[(int)uVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_start;
              piVar15 = this->tin[(int)uVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_finish;
              if (piVar17 != piVar15) {
                iVar14 = ((this->super_Solver).game)->_priority[uVar13];
                do {
                  attractTangle(this,*piVar17,player,R,Z,G,iVar14);
                  piVar17 = piVar17 + 1;
                } while (piVar17 != piVar15);
              }
              iVar14 = (this->Q).pointer;
            }
          }
        }
        bVar24 = 0 < (long)uVar13;
        uVar13 = uVar13 - 1;
      } while (bVar24);
    }
    pGVar23 = (this->super_Solver).game;
    uVar13 = pGVar23->n_vertices;
    uVar7 = (int)uVar13 - 1;
    if ((int)uVar7 < 0) {
      uVar22 = 0;
    }
    else {
      puVar4 = V->_bits;
      piVar17 = this->Candidates;
      puVar5 = (this->Z)._bits;
      uVar22 = 0;
      uVar8 = (ulong)uVar7;
      do {
        if ((puVar4[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0) {
          if ((uint)(((pGVar23->_owner)._bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0) == player) {
            uVar12 = (ulong)pGVar23->_outedges[pGVar23->_firstouts[uVar8]];
            bVar24 = uVar12 != 0xffffffffffffffff;
            if (bVar24) {
              if ((puVar5[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0) goto LAB_0017e631;
              piVar15 = pGVar23->_outedges + (long)pGVar23->_firstouts[uVar8] + 1;
              do {
                uVar12 = (ulong)*piVar15;
                bVar24 = uVar12 != 0xffffffffffffffff;
                if (uVar12 == 0xffffffffffffffff) break;
                piVar15 = piVar15 + 1;
              } while ((puVar5[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0);
            }
LAB_0017e61d:
            if (bVar24) goto LAB_0017e631;
          }
          else {
            uVar7 = pGVar23->_outedges[pGVar23->_firstouts[uVar8]];
            if (uVar7 != 0xffffffff) {
              puVar16 = (uint *)(pGVar23->_outedges + (long)pGVar23->_firstouts[uVar8] + 1);
              bVar24 = false;
              bVar18 = 0;
              do {
                if ((puVar5[(ulong)(long)(int)uVar7 >> 6] >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
                  cVar25 = (G->_bits[(ulong)(long)(int)uVar7 >> 6] & 1L << ((ulong)uVar7 & 0x3f)) !=
                           0;
                }
                else {
                  bVar18 = 1;
                  cVar25 = '\a';
                }
                if ((cVar25 != '\a') && (cVar25 != '\0')) break;
                uVar7 = *puVar16;
                puVar16 = puVar16 + 1;
                bVar24 = uVar7 == 0xffffffff;
              } while (!bVar24);
              bVar24 = (bool)(bVar24 & bVar18);
              goto LAB_0017e61d;
            }
          }
          lVar21 = (long)(int)uVar22;
          uVar22 = uVar22 + 1;
          piVar17[lVar21] = (int)uVar8;
        }
LAB_0017e631:
        bVar24 = 0 < (long)uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar24);
    }
    if (uVar22 == 0) {
      if (0 < (long)uVar13) {
        puVar4 = V->_bits;
        uVar8 = 0;
        do {
          if ((puVar4[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0) {
            val[uVar8] = 0x7fffffff;
          }
          uVar8 = uVar8 + 1;
        } while (uVar13 != uVar8);
      }
      sVar6 = (this->Z)._bitssize;
      if (sVar6 != 0) {
        memset((this->Z)._bits,0,sVar6 << 3);
      }
      bVar24 = false;
    }
    else {
      pGVar23 = (this->super_Solver).game;
      uVar13 = pGVar23->n_vertices;
      if (-1 < (long)uVar13) {
        uVar8 = 0;
        uVar20 = 0;
        iVar14 = 0;
LAB_0017e6af:
        puVar4 = (this->Z)._bits;
        lVar21 = (long)(int)uVar20 + -1;
        while (iVar9 = iVar14, uVar13 != uVar8) {
          uVar12 = uVar8 >> 6;
          if ((R->_bits[uVar12] >> (uVar8 & 0x3f) & 1) != 0) {
            uVar11 = 1L << (uVar8 & 0x3f);
            if ((puVar4[uVar12] & uVar11) == 0) {
              iVar2 = pGVar23->_priority[uVar8];
              if ((this->Q).pointer == 0) {
                iVar9 = iVar2;
              }
              if (iVar2 <= iVar14) {
                iVar9 = iVar14;
              }
              if (iVar9 < iVar2) goto LAB_0017e74a;
              piVar17 = pGVar23->_outedges;
              lVar21 = (long)pGVar23->_firstouts[uVar8];
              uVar7 = piVar17[lVar21];
              if ((uint)(((pGVar23->_owner)._bits[uVar12] & uVar11) != 0) != player) {
                if (uVar7 == 0xffffffff) goto LAB_0017ead8;
                puVar16 = (uint *)(piVar17 + lVar21 + 1);
                bVar24 = false;
                bVar18 = 0;
                goto LAB_0017ea59;
              }
              bVar24 = uVar7 != 0xffffffff;
              if (uVar7 == 0xffffffff) goto LAB_0017eaa8;
              if ((puVar4[(ulong)(long)(int)uVar7 >> 6] >> ((long)(int)uVar7 & 0x3fU) & 1) != 0)
              goto LAB_0017eaae;
              piVar17 = piVar17 + lVar21 + 1;
              goto LAB_0017ea14;
            }
          }
          uVar20 = uVar20 + 1;
          lVar1 = lVar21 + 1;
          uVar8 = lVar21 + 2;
          lVar21 = lVar1;
          if ((long)uVar13 <= lVar1) goto LAB_0017eb89;
        }
        if ((this->Q).pointer != 0) {
LAB_0017e74a:
          iVar14 = (this->Q).pointer;
          while (iVar14 != 0) {
            (this->Q).pointer = iVar14 + -1;
            v = (this->Q).queue[(long)iVar14 + -1];
            attractVertices(this,player,v,R,Z,G,iVar9);
            piVar15 = this->tin[(int)v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            for (piVar17 = this->tin[(int)v].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start; piVar17 != piVar15;
                piVar17 = piVar17 + 1) {
              attractTangle(this,*piVar17,player,R,Z,G,iVar9);
            }
            iVar14 = (this->Q).pointer;
          }
          if (0 < (int)uVar22) {
            pGVar23 = (this->super_Solver).game;
            piVar17 = this->Candidates;
            puVar4 = (this->Z)._bits;
            uVar13 = 0;
            do {
              uVar8 = (ulong)piVar17[uVar13];
              if (uVar8 == 0xffffffffffffffff) {
                iVar14 = 0x15;
              }
              else {
                iVar14 = 0x13;
                if (iVar9 < pGVar23->_priority[uVar8]) {
                  if ((uint)(((pGVar23->_owner)._bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0) ==
                      player) {
                    uVar12 = (ulong)pGVar23->_outedges[pGVar23->_firstouts[uVar8]];
                    bVar24 = uVar12 != 0xffffffffffffffff;
                    if (uVar12 == 0xffffffffffffffff) {
LAB_0017e961:
                      if (bVar24) goto LAB_0017e967;
                    }
                    else {
                      if ((puVar4[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0) {
                        piVar15 = pGVar23->_outedges + (long)pGVar23->_firstouts[uVar8] + 1;
                        do {
                          uVar8 = (ulong)*piVar15;
                          bVar24 = uVar8 != 0xffffffffffffffff;
                          if (uVar8 == 0xffffffffffffffff) break;
                          piVar15 = piVar15 + 1;
                        } while ((puVar4[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0);
                        goto LAB_0017e961;
                      }
LAB_0017e967:
                      piVar17[uVar13] = -1;
                    }
                    iVar14 = 0;
                  }
                  else {
                    uVar7 = pGVar23->_outedges[pGVar23->_firstouts[uVar8]];
                    if (uVar7 != 0xffffffff) {
                      puVar16 = (uint *)(pGVar23->_outedges + (long)pGVar23->_firstouts[uVar8] + 1);
                      bVar24 = false;
                      bVar18 = 0;
                      do {
                        if ((puVar4[(ulong)(long)(int)uVar7 >> 6] >> ((ulong)uVar7 & 0x3f) & 1) == 0
                           ) {
                          cVar25 = (G->_bits[(ulong)(long)(int)uVar7 >> 6] &
                                   1L << ((ulong)uVar7 & 0x3f)) != 0;
                        }
                        else {
                          bVar18 = 1;
                          cVar25 = '\a';
                        }
                        if ((cVar25 != '\a') && (cVar25 != '\0')) break;
                        uVar7 = *puVar16;
                        puVar16 = puVar16 + 1;
                        bVar24 = uVar7 == 0xffffffff;
                      } while (!bVar24);
                      bVar24 = (bool)(bVar24 & bVar18);
                      goto LAB_0017e961;
                    }
                    iVar14 = 0;
                  }
                }
              }
            } while (((iVar14 == 0x15) || (iVar14 == 0)) && (uVar13 = uVar13 + 1, uVar13 != uVar22))
            ;
          }
          goto LAB_0017eaea;
        }
      }
LAB_0017eb89:
      if ((int)uVar22 < 1) {
        bVar24 = false;
      }
      else {
        piVar17 = this->Candidates;
        puVar4 = V->_bits;
        uVar13 = 0;
        bVar24 = false;
        do {
          iVar14 = piVar17[uVar13];
          uVar8 = (ulong)iVar14;
          if (uVar8 != 0xffffffffffffffff) {
            val[uVar8] = iVar19;
            bVar18 = (byte)iVar14 & 0x3f;
            puVar4[uVar8 >> 6] =
                 puVar4[uVar8 >> 6] & (-2L << bVar18 | 0xfffffffffffffffeU >> 0x40 - bVar18);
            bVar24 = true;
          }
          uVar13 = uVar13 + 1;
        } while (uVar22 != uVar13);
      }
      sVar6 = (this->Z)._bitssize;
      if (sVar6 != 0) {
        memset((this->Z)._bits,0,sVar6 << 3);
      }
      iVar19 = iVar19 + 1;
      if ((!bVar24) && (uVar13 = pGVar23->n_vertices, 0 < (long)uVar13)) {
        puVar4 = V->_bits;
        uVar8 = 0;
        do {
          if ((puVar4[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0) {
            val[uVar8] = 0x7fffffff;
          }
          uVar8 = uVar8 + 1;
        } while (uVar13 != uVar8);
      }
    }
  } while (bVar24);
LAB_0017ecac:
  return sVar3 != sVar10;
  while( true ) {
    uVar7 = *puVar16;
    puVar16 = puVar16 + 1;
    bVar24 = uVar7 == 0xffffffff;
    if (bVar24) break;
LAB_0017ea59:
    if ((puVar4[(ulong)(long)(int)uVar7 >> 6] >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
      cVar25 = (G->_bits[(ulong)(long)(int)uVar7 >> 6] & 1L << ((ulong)uVar7 & 0x3f)) != 0;
    }
    else {
      bVar18 = 1;
      cVar25 = '\a';
    }
    if ((cVar25 != '\a') && (cVar25 != '\0')) break;
  }
  bVar24 = (bool)(bVar24 & bVar18);
  goto LAB_0017eaa8;
  while (piVar17 = piVar17 + 1, (puVar4[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
LAB_0017ea14:
    uVar13 = (ulong)*piVar17;
    bVar24 = uVar13 != 0xffffffffffffffff;
    if (uVar13 == 0xffffffffffffffff) break;
  }
LAB_0017eaa8:
  if (bVar24) {
LAB_0017eaae:
    puVar4[uVar12] = puVar4[uVar12] | uVar11;
    iVar14 = (this->Q).pointer;
    (this->Q).pointer = iVar14 + 1;
    (this->Q).queue[iVar14] = uVar20;
  }
LAB_0017ead8:
  uVar20 = uVar20 + 1;
LAB_0017eaea:
  pGVar23 = (this->super_Solver).game;
  uVar13 = pGVar23->n_vertices;
  uVar8 = (ulong)(int)uVar20;
  iVar14 = iVar9;
  if ((long)uVar13 < (long)uVar8) goto LAB_0017eb89;
  goto LAB_0017e6af;
}

Assistant:

bool
DTLSolver::computeDistanceValues(bitset &V, bitset &R, bitset &G, int* val, const int player)
{
    int dist = 1; // start distance 1

    while (V.any()) {
        // make the partition (attract lower to higher)
        for (int top=nodecount()-1; top>=0; top--) {
            if (V[top] and !Z[top]) {
                Z[top] = true;
                str[top] = -1; // avoid valgrind warnings...
                Q.push(top);
                while (Q.nonempty()) {
                    const int v = Q.pop();
                    attractVertices(player, v, R, Z, G, priority(top));
                    attractTangles(player, v, R, Z, G, priority(top));
                }
            }
        }

        // find candidate vertices to remove from V
        int n_candidates = 0;

        for (int v=nodecount()-1; v>=0; v--) {
            if (V[v] and !attracts(player, v, Z, G)) Candidates[n_candidates++] = v;
        }
        if (n_candidates == 0) {
            for (int v=0; v<nodecount(); v++) if (V[v]) val[v] = INT_MAX;
            Z.reset();
            return true;
        }

        // attract higher to lower
        int t = 0;
        for (int v=0; v<=nodecount();) {
            if (v == nodecount()) {
                if (Q.empty()) break;
            } else if (!R[v] or Z[v]) {
                v++;
                continue; // only attract vertices in <R\Z>
            } else {
                if (priority(v) > t and Q.empty()) t = priority(v);
                if (priority(v) <= t) {
                    if (attracts(player, v, Z, G)) {
                        Z[v] = true;
                        Q.push(v);
                    }
                    v++;
                    continue;
                } 
            }

            while (Q.nonempty()) {
                const int u = Q.pop();
                attractVertices(player, u, R, Z, G, t);
                attractTangles(player, u, R, Z, G, t);
            }

            for (int x=0; x<n_candidates; x++) {
                const int u = Candidates[x];
                if (u == -1) continue;
                if (priority(u) <= t) break; // stop checking once we are below the threshold
                if (attracts(player, u, Z, G)) Candidates[x] = -1;
            }
        }

        // remaining Candidates have no path from high to low, remove them from V

        bool V_changed = false;
        for (int x=0; x<n_candidates; x++) {
            const int u = Candidates[x];
            if (u == -1) continue;
            val[u] = dist;
            V[u] = false;
            V_changed = true;
        }

        Z.reset();
        dist++;

        if (!V_changed) {
            for (int v=0; v<nodecount(); v++) if (V[v]) val[v] = INT_MAX;
            return true;
        }
    }

    return false;
}